

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

optional<int> __thiscall
node::anon_unknown_2::ChainImpl::findLocatorFork(ChainImpl *this,CBlockLocator *locator)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar1;
  Chainstate *this_00;
  CBlockIndex *pCVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &cs_main.super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  puVar1 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  this_00 = ChainstateManager::ActiveChainstate
                      ((puVar1->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar2 = Chainstate::FindForkInGlobalIndex(this_00,locator);
  if (pCVar2 == (CBlockIndex *)0x0) {
    uVar4 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)(uint)pCVar2->nHeight;
    uVar4 = 0x100000000;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)(uVar3 | uVar4);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int> findLocatorFork(const CBlockLocator& locator) override
    {
        LOCK(::cs_main);
        if (const CBlockIndex* fork = chainman().ActiveChainstate().FindForkInGlobalIndex(locator)) {
            return fork->nHeight;
        }
        return std::nullopt;
    }